

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autograd.h
# Opt level: O0

void __thiscall yyml::nn::Autograd<double>::~Autograd(Autograd<double> *this)

{
  Autograd<double> *this_local;
  
  std::function<void_()>::~function(&this->backward_fn);
  std::vector<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>::~vector
            (&this->next);
  return;
}

Assistant:

Autograd(std::vector<Autograd*> next, Variable<Type>* variable_ptr,
           BackwardFunction<Type> backward_fn)
      : next(next), variable_ptr(variable_ptr), backward_fn(backward_fn) {}